

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O3

Int32 __thiscall
Diligent::
DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
::GetUniqueID(DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              *this)

{
  int iVar1;
  string msg;
  string local_30;
  
  iVar1 = this->m_UniqueID;
  if (iVar1 == 0) {
    FormatString<char[103]>
              (&local_30,
               (char (*) [103])
               "Unique ID is not initialized. This indicates that this device object has been created without a device"
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetUniqueID",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xa1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    iVar1 = this->m_UniqueID;
  }
  return iVar1;
}

Assistant:

GetUniqueID() const override final
    {
        VERIFY(m_UniqueID != 0, "Unique ID is not initialized. This indicates that this device object has been created without a device");
        return m_UniqueID;
    }